

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::
     TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  bool bVar1;
  ulong in_RCX;
  ulong in_RDX;
  ColumnWriterStatistics *in_RSI;
  ParquetIntervalTargetType target_value_00;
  ParquetIntervalTargetType target_value;
  idx_t r;
  idx_t local_write_count;
  ParquetIntervalTargetType local_write [2048];
  interval_t *ptr;
  undefined4 in_stack_ffffffffffff9f68;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffff9f70;
  undefined4 in_stack_ffffffffffff9f74;
  undefined4 in_stack_ffffffffffff9f78;
  undefined4 in_stack_ffffffffffff9f7c;
  undefined4 uStack_6080;
  undefined4 local_6070;
  undefined8 local_6048;
  interval_t in_stack_ffffffffffff9fc8;
  
  FlatVector::GetData<duckdb::interval_t>((Vector *)0x5a6404);
  uStack_6080 = in_stack_ffffffffffff9f70;
  local_6070 = in_stack_ffffffffffff9f74;
  for (local_6048 = in_RDX; local_6048 < in_RCX; local_6048 = local_6048 + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)
                       CONCAT44(in_stack_ffffffffffff9f7c,in_stack_ffffffffffff9f78),
                       CONCAT44(local_6070,uStack_6080));
    if (bVar1) {
      target_value_00 =
           ParquetIntervalOperator::Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                     (in_stack_ffffffffffff9fc8);
      local_6070 = target_value_00.bytes._8_4_;
      uVar2 = target_value_00.bytes._0_4_;
      uStack_6080 = target_value_00.bytes._4_4_;
      in_stack_ffffffffffff9f7c = uVar2;
      BaseParquetOperator::HandleStats<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                (in_RSI,target_value_00);
      ParquetIntervalOperator::WriteToStream<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                ((ParquetIntervalTargetType *)CONCAT44(local_6070,uStack_6080),
                 (WriteStream *)CONCAT44(uVar2,in_stack_ffffffffffff9f68));
    }
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}